

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void assessColPrimalSolution
               (HighsOptions *options,double primal,double lower,double upper,HighsVarType type,
               double *col_infeasibility,double *integer_infeasibility)

{
  double dVar1;
  double dVar2;
  
  *col_infeasibility = 0.0;
  dVar1 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  if (lower - dVar1 <= primal) {
    if (primal <= dVar1 + upper) goto LAB_00261275;
    dVar1 = primal - upper;
  }
  else {
    dVar1 = lower - primal;
  }
  *col_infeasibility = dVar1;
LAB_00261275:
  dVar1 = 0.0;
  if ((type & ~kSemiContinuous) == kInteger) {
    dVar1 = round(primal);
    dVar1 = ABS(primal - dVar1);
  }
  *integer_infeasibility = dVar1;
  if (((type & ~kInteger) == kSemiContinuous) && (dVar1 = *col_infeasibility, 0.0 < dVar1)) {
    if (ABS(primal) <= (options->super_HighsOptionsStruct).mip_feasibility_tolerance) {
      *col_infeasibility = 0.0;
    }
    else if ((primal < upper) && ((dVar1 != 0.0 || (NAN(dVar1))))) {
      dVar2 = *integer_infeasibility;
      if (*integer_infeasibility <= dVar1) {
        dVar2 = dVar1;
      }
      *integer_infeasibility = dVar2;
    }
  }
  return;
}

Assistant:

void assessColPrimalSolution(const HighsOptions& options, const double primal,
                             const double lower, const double upper,
                             const HighsVarType type, double& col_infeasibility,
                             double& integer_infeasibility) {
  // @primal_infeasibility calculation
  col_infeasibility = 0;
  if (primal < lower - options.primal_feasibility_tolerance) {
    col_infeasibility = lower - primal;
  } else if (primal > upper + options.primal_feasibility_tolerance) {
    col_infeasibility = primal - upper;
  }
  integer_infeasibility = 0;
  if (type == HighsVarType::kInteger || type == HighsVarType::kSemiInteger) {
    integer_infeasibility = fractionality(primal);
  }
  if (col_infeasibility > 0 && (type == HighsVarType::kSemiContinuous ||
                                type == HighsVarType::kSemiInteger)) {
    // Semi-variables at zero will have positive col
    // infeasibility, so possibly zero this
    if (std::fabs(primal) <= options.mip_feasibility_tolerance)
      col_infeasibility = 0;
    // If there is (still) column infeasibility due to value being
    // off zero or below lower bound, then this counts as an integer
    // infeasibility
    if (col_infeasibility && primal < upper)
      integer_infeasibility =
          std::max(col_infeasibility, integer_infeasibility);
  }
}